

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitSwitch(AsmJSByteCodeGenerator *this,ParseNodeSwitch *pnode)

{
  AsmJsByteCodeWriter *this_00;
  ParseNode *this_01;
  AsmJsFunc *pAVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot R0;
  ByteCodeLabel BVar4;
  uint labelID;
  Types type;
  undefined4 *puVar5;
  ulong extraout_RAX;
  undefined8 uVar6;
  ParseNodeFloat *pPVar7;
  EmitExpressionInfo EVar8;
  ulong extraout_RAX_00;
  RegisterSpace *this_02;
  AsmJsCompilationException *this_03;
  ParseNodeCase *pPVar10;
  ParseNodePtr pnode_00;
  ParseNodeSwitch *node;
  EmitExpressionInfo local_50;
  EmitExpressionInfo local_48;
  ParseNodeSwitch *local_40;
  uint local_34;
  ulong uVar9;
  
  pnode_00 = pnode->pnodeVal;
  if (pnode_00 == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x92d,"(pnode->pnodeVal != __null)","pnode->pnodeVal != NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pnode_00 = pnode->pnodeVal;
  }
  local_40 = pnode;
  local_50 = Emit(this,pnode_00);
  bVar3 = AsmJsType::isSigned(&local_50.type);
  if (!bVar3) {
    this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_03,L"Switch value must be type Signed, FixNum");
LAB_00939c66:
    __cxa_throw(this_03,&AsmJsCompilationException::typeinfo,0);
  }
  R0 = GetAndReleaseUnaryLocations<int>(this,&local_50);
  node = local_40;
  this_00 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,(ParseNode *)local_40,0);
  AsmJsByteCodeWriter::AsmReg2(this_00,BeginSwitch_Int,R0,local_50.super_EmitInfoBase.location);
  ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,(ParseNode *)node);
  pPVar10 = node->pnodeCases;
  uVar9 = extraout_RAX;
  if (pPVar10 == (ParseNodeCase *)0x0) {
LAB_00939b78:
    if ((node->super_ParseNodeStmt).emitLabels == true) {
      labelID = (node->super_ParseNodeStmt).breakLabel;
    }
    else {
      labelID = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
      uVar9 = (ulong)labelID;
      (node->super_ParseNodeStmt).breakLabel = labelID;
    }
    local_34 = (uint)CONCAT71((int7)(uVar9 >> 8),1);
  }
  else {
    uVar6 = CONCAT71((int7)(extraout_RAX >> 8),1);
    do {
      local_34 = (uint)uVar6;
      while( true ) {
        BVar4 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
        pPVar10->labelCase = BVar4;
        if (pPVar10 == node->pnodeDefault) break;
        this_01 = pPVar10->pnodeExpr;
        if (this_01->nop == knopFlt) {
          pPVar7 = ParseNode::AsParseNodeFloat(this_01);
          if ((pPVar7->field_0x18 & 1) != 0) {
            pPVar7 = ParseNode::AsParseNodeFloat(this_01);
            if ((pPVar7->dbl == -2147483648.0) && (!NAN(pPVar7->dbl))) goto LAB_00939b2c;
          }
LAB_00939c48:
          this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_03,L"Switch case value must be int in the range [-2^31, 2^31)");
          goto LAB_00939c66;
        }
        if (this_01->nop != knopInt) goto LAB_00939c48;
        ParseNode::AsParseNodeInt(this_01);
LAB_00939b2c:
        EVar8 = Emit(this,pPVar10->pnodeExpr);
        AsmJsByteCodeWriter::AsmBrReg2
                  (this_00,Case_Int,pPVar10->labelCase,R0,EVar8.super_EmitInfoBase.location.location
                  );
        pPVar10 = pPVar10->pnodeNext;
        node = local_40;
        if (pPVar10 == (ParseNodeCase *)0x0) {
          uVar9 = extraout_RAX_00;
          if ((local_34 & 1) == 0) goto LAB_00939b9a;
          goto LAB_00939b78;
        }
      }
      pPVar10 = pPVar10->pnodeNext;
      uVar6 = 0;
    } while (pPVar10 != (ParseNodeCase *)0x0);
LAB_00939b9a:
    labelID = node->pnodeDefault->labelCase;
    local_34 = 0;
  }
  AsmJsByteCodeWriter::AsmBr(this_00,labelID,EndSwitch_Int);
  pPVar10 = node->pnodeCases;
  if (pPVar10 != (ParseNodeCase *)0x0) {
    do {
      AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,pPVar10->labelCase);
      local_48 = Emit(this,(ParseNode *)pPVar10->pnodeBody);
      AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_48);
      pPVar10 = pPVar10->pnodeNext;
    } while (pPVar10 != (ParseNodeCase *)0x0);
  }
  pAVar1 = this->mFunction;
  type = WAsmJs::FromPrimitiveType<int>();
  this_02 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,type);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(this_02,R0);
  if (((char)local_34 != '\0') || ((local_40->super_ParseNodeStmt).emitLabels == true)) {
    AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(local_40->super_ParseNodeStmt).breakLabel);
  }
  EVar8.super_EmitInfoBase.location = 0xffffffff;
  EVar8.type.which_ = Void;
  return EVar8;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitSwitch( ParseNodeSwitch * pnode )
    {
        BOOL fHasDefault = false;
        Assert( pnode->pnodeVal != NULL );
        const EmitExpressionInfo& valInfo = Emit( pnode->pnodeVal );

        if( !valInfo.type.isSigned() )
        {
            throw AsmJsCompilationException( _u("Switch value must be type Signed, FixNum") );
        }

        RegSlot regVal = GetAndReleaseUnaryLocations<int>( &valInfo );
        StartStatement(pnode);
        mWriter.AsmReg2(OpCodeAsmJs::BeginSwitch_Int, regVal, valInfo.location);
        EndStatement(pnode);

        // TODO: if all cases are compile-time constants, emit a switch statement in the byte
        // code so the BE can optimize it.

        ParseNodeCase *pnodeCase;
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            // Jump to the first case body if this one doesn't match. Make sure any side-effects of the case
            // expression take place regardless.
            pnodeCase->labelCase = mWriter.DefineLabel();
            if( pnodeCase == pnode->pnodeDefault )
            {
                fHasDefault = true;
                continue;
            }
            ParseNode* caseExpr = pnodeCase->pnodeExpr;
            if ((caseExpr->nop != knopInt || (caseExpr->AsParseNodeInt()->lw >> 31) > 1) && !ParserWrapper::IsMinInt(caseExpr))
            {
                throw AsmJsCompilationException( _u("Switch case value must be int in the range [-2^31, 2^31)") );
            }

            const EmitExpressionInfo& caseExprInfo = Emit( pnodeCase->pnodeExpr );
            mWriter.AsmBrReg2( OpCodeAsmJs::Case_Int, pnodeCase->labelCase, regVal, caseExprInfo.location );
            // do not need to release location because int constants cannot be released
        }

        // No explicit case value matches. Jump to the default arm (if any) or break out altogether.
        if( fHasDefault )
        {
            mWriter.AsmBr( pnode->pnodeDefault->labelCase, OpCodeAsmJs::EndSwitch_Int );
        }
        else
        {
            if( !pnode->emitLabels )
            {
                pnode->breakLabel = mWriter.DefineLabel();
            }
            mWriter.AsmBr( pnode->breakLabel, OpCodeAsmJs::EndSwitch_Int );
        }
        // Now emit the case arms to which we jump on matching a case value.
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            mWriter.MarkAsmJsLabel( pnodeCase->labelCase );
            const EmitExpressionInfo& caseBodyInfo = Emit( pnodeCase->pnodeBody );
            mFunction->ReleaseLocationGeneric( &caseBodyInfo );
        }

        mFunction->ReleaseTmpRegister<int>( regVal );

        if( !fHasDefault || pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }

        return EmitExpressionInfo( AsmJsType::Void );
    }